

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
::find<google::protobuf::Symbol>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
           *this,key_arg<google::protobuf::Symbol> *key)

{
  ctrl_t *pcVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  ushort x;
  uint32_t uVar4;
  EqualElement<google::protobuf::Symbol> *f;
  size_t sVar5;
  ctrl_t *pcVar6;
  slot_type *psVar7;
  Symbol *ts;
  Symbol *ts_00;
  ulong extraout_RDX;
  key_arg<google::protobuf::Symbol> *s;
  ulong uVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  __m128i match;
  ctrl_t cVar11;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  undefined1 auVar12 [16];
  iterator iVar28;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_88;
  ctrl_t *local_70;
  key_arg<google::protobuf::Symbol> *local_68;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
  *local_60;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  undefined1 local_48 [16];
  
  s = key;
  AssertOnFind<google::protobuf::Symbol>(this,key);
  bVar3 = is_soo(this);
  if (bVar3) {
    bVar3 = is_soo(this);
    if (!bVar3) {
      __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe21,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                   );
    }
    bVar3 = empty(this);
    if (!bVar3) {
      local_88.mask_ = (size_t)key;
      local_88.offset_ = (size_t)this;
      f = (EqualElement<google::protobuf::Symbol> *)soo_slot(this);
      bVar3 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
              ::
              apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,std::allocator<google::protobuf::Symbol>>::EqualElement<google::protobuf::Symbol>,google::protobuf::Symbol&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                        ((hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                          *)&local_88,f,ts);
      if (bVar3) {
        iVar28 = soo_iterator(this);
        return iVar28;
      }
    }
  }
  else {
    prefetch_heap_block(this);
    sVar5 = google::protobuf::(anonymous_namespace)::SymbolByFullNameHash::operator()
                      ((SymbolByFullNameHash *)key,s);
    bVar3 = is_soo(this);
    if (bVar3) {
      __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe2a,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                   );
    }
    probe(&local_88,(CommonFields *)this,sVar5);
    pcVar6 = control(this);
    auVar10 = ZEXT216(CONCAT11((char)sVar5,(char)sVar5) & 0x7f7f);
    auVar10 = pshuflw(auVar10,auVar10,0);
    uVar9 = auVar10._0_4_;
    local_48._4_4_ = uVar9;
    local_48._0_4_ = uVar9;
    local_48._8_4_ = uVar9;
    local_48._12_4_ = uVar9;
    while( true ) {
      pcVar1 = pcVar6 + local_88.offset_;
      auVar10[0] = -(local_48[0] == *pcVar1);
      auVar10[1] = -(local_48[1] == pcVar1[1]);
      auVar10[2] = -(local_48[2] == pcVar1[2]);
      auVar10[3] = -(local_48[3] == pcVar1[3]);
      auVar10[4] = -(local_48[4] == pcVar1[4]);
      auVar10[5] = -(local_48[5] == pcVar1[5]);
      auVar10[6] = -(local_48[6] == pcVar1[6]);
      auVar10[7] = -(local_48[7] == pcVar1[7]);
      auVar10[8] = -(local_48[8] == pcVar1[8]);
      auVar10[9] = -(local_48[9] == pcVar1[9]);
      auVar10[10] = -(local_48[10] == pcVar1[10]);
      auVar10[0xb] = -(local_48[0xb] == pcVar1[0xb]);
      auVar10[0xc] = -(local_48[0xc] == pcVar1[0xc]);
      auVar10[0xd] = -(local_48[0xd] == pcVar1[0xd]);
      auVar10[0xe] = -(local_48[0xe] == pcVar1[0xe]);
      auVar10[0xf] = -(local_48[0xf] == pcVar1[0xf]);
      cVar11 = *pcVar1;
      cVar13 = pcVar1[1];
      cVar14 = pcVar1[2];
      cVar15 = pcVar1[3];
      cVar16 = pcVar1[4];
      cVar17 = pcVar1[5];
      cVar18 = pcVar1[6];
      cVar19 = pcVar1[7];
      cVar20 = pcVar1[8];
      cVar21 = pcVar1[9];
      cVar22 = pcVar1[10];
      cVar23 = pcVar1[0xb];
      cVar24 = pcVar1[0xc];
      cVar25 = pcVar1[0xd];
      cVar26 = pcVar1[0xe];
      cVar27 = pcVar1[0xf];
      for (x = (ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe | (ushort)(auVar10[0xf] >> 7) << 0xf;
          x != 0; x = x - 1 & x) {
        local_70 = pcVar6;
        local_58 = cVar11;
        cStack_57 = cVar13;
        cStack_56 = cVar14;
        cStack_55 = cVar15;
        cStack_54 = cVar16;
        cStack_53 = cVar17;
        cStack_52 = cVar18;
        cStack_51 = cVar19;
        cStack_50 = cVar20;
        cStack_4f = cVar21;
        cStack_4e = cVar22;
        cStack_4d = cVar23;
        cStack_4c = cVar24;
        cStack_4b = cVar25;
        cStack_4a = cVar26;
        cStack_49 = cVar27;
        uVar4 = TrailingZeros<unsigned_short>(x);
        local_68 = key;
        local_60 = this;
        psVar7 = slot_array(this);
        bVar3 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                ::
                apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,std::allocator<google::protobuf::Symbol>>::EqualElement<google::protobuf::Symbol>,google::protobuf::Symbol&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                          ((hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                            *)&local_68,
                           (EqualElement<google::protobuf::Symbol> *)
                           (psVar7 + ((long)&(((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                                *)local_88.offset_)->
                                             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                             ).
                                             super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                             .value.capacity_ + (ulong)uVar4 & local_88.mask_)),
                           ts_00);
        if (bVar3) {
          iVar28 = iterator_at(this,(long)&(((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                                              *)local_88.offset_)->
                                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                           ).
                                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                           .value.capacity_ + (ulong)uVar4 & local_88.mask_);
          return iVar28;
        }
        pcVar6 = local_70;
        cVar11 = local_58;
        cVar13 = cStack_57;
        cVar14 = cStack_56;
        cVar15 = cStack_55;
        cVar16 = cStack_54;
        cVar17 = cStack_53;
        cVar18 = cStack_52;
        cVar19 = cStack_51;
        cVar20 = cStack_50;
        cVar21 = cStack_4f;
        cVar22 = cStack_4e;
        cVar23 = cStack_4d;
        cVar24 = cStack_4c;
        cVar25 = cStack_4b;
        cVar26 = cStack_4a;
        cVar27 = cStack_49;
      }
      auVar12[0] = -(cVar11 == kEmpty);
      auVar12[1] = -(cVar13 == kEmpty);
      auVar12[2] = -(cVar14 == kEmpty);
      auVar12[3] = -(cVar15 == kEmpty);
      auVar12[4] = -(cVar16 == kEmpty);
      auVar12[5] = -(cVar17 == kEmpty);
      auVar12[6] = -(cVar18 == kEmpty);
      auVar12[7] = -(cVar19 == kEmpty);
      auVar12[8] = -(cVar20 == kEmpty);
      auVar12[9] = -(cVar21 == kEmpty);
      auVar12[10] = -(cVar22 == kEmpty);
      auVar12[0xb] = -(cVar23 == kEmpty);
      auVar12[0xc] = -(cVar24 == kEmpty);
      auVar12[0xd] = -(cVar25 == kEmpty);
      auVar12[0xe] = -(cVar26 == kEmpty);
      auVar12[0xf] = -(cVar27 == kEmpty);
      if ((((((((((((((((auVar12 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar12 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar12 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar12 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar12 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar12 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar12 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar12 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar12 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar12 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar12 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar12 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar12 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar12 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar27 == kEmpty)
      break;
      uVar8 = local_88.index_ + 0x10;
      local_88.offset_ =
           (long)&(((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                     *)local_88.offset_)->
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.heap_or_soo_ + local_88.index_ & local_88.mask_;
      local_88.index_ = uVar8;
      sVar5 = capacity(this);
      if (sVar5 < uVar8) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                     );
      }
    }
  }
  AssertNotDebugCapacity(this);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = extraout_RDX;
  return (iterator)(auVar2 << 0x40);
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertOnFind(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }